

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::SimpleTimeZone::checkTransitionRules(SimpleTimeZone *this,UErrorCode *status)

{
  SimpleTimeZone *ncThis;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  umtx_lock_63((UMutex *)gLock);
  if (this->transitionRulesInitialized == '\0') {
    initTransitionRules(this,status);
  }
  umtx_unlock_63((UMutex *)gLock);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }